

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

bool __thiscall
QOpenGLProgramBinaryCache::setProgramBinary
          (QOpenGLProgramBinaryCache *this,uint programId,uint blobFormat,void *p,uint blobSize)

{
  char *function;
  bool bVar1;
  GLenum GVar2;
  GLenum GVar3;
  uint in_EDX;
  uint in_ESI;
  uint in_R8D;
  long in_FS_OFFSET;
  GLenum err;
  GLenum error;
  QOpenGLExtraFunctions *funcs;
  QOpenGLContext *context;
  GLint linkStatus;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  GLenum in_stack_ffffffffffffff08;
  GLuint in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  GLenum in_stack_ffffffffffffff18;
  GLuint in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  bool local_a1;
  char local_a0 [32];
  char local_80 [36];
  uint local_5c;
  char local_58 [32];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::currentContext();
  QOpenGLContext::extraFunctions((QOpenGLContext *)0x910737);
  do {
    GVar2 = QOpenGLFunctions::glGetError
                      ((QOpenGLFunctions *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (GVar2 == 0) break;
  } while (GVar2 != 0x507);
  QOpenGLExtraFunctions::glProgramBinary
            ((QOpenGLExtraFunctions *)CONCAT44(GVar2,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c);
  GVar3 = QOpenGLFunctions::glGetError
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (GVar3 == 0) {
    local_5c = 0;
    QOpenGLFunctions::glGetProgramiv
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,(GLint *)0x910862);
    if (local_5c == 1) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91096f);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(GVar2,GVar3),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff14,
                   (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (char *)0x910985);
        QMessageLogger::debug
                  (local_a0,"Program binary set for program %u, size %d, format 0x%x, err = 0x%x",
                   (ulong)in_ESI,(ulong)in_R8D,(ulong)in_EDX,(ulong)GVar3);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      local_a1 = true;
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9108c3);
        function = (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff08 = GVar3;
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(GVar2,GVar3),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff14,function,(char *)0x9108d9);
        GVar3 = in_stack_ffffffffffffff08;
        QMessageLogger::debug
                  (local_80,
                   "Program binary failed to load for program %u, size %d, format 0x%x, linkStatus = 0x%x, err = 0x%x"
                   ,(ulong)in_ESI,(ulong)in_R8D,(ulong)in_EDX,(ulong)local_5c);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      local_a1 = false;
    }
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9107e7);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(GVar2,GVar3),
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (char *)0x910800);
      QMessageLogger::debug
                (local_58,
                 "Program binary failed to load for program %u, size %d, format 0x%x, err = 0x%x",
                 (ulong)in_ESI,(ulong)in_R8D,(ulong)in_EDX,(ulong)GVar3);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_a1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a1;
}

Assistant:

bool QOpenGLProgramBinaryCache::setProgramBinary(uint programId, uint blobFormat, const void *p, uint blobSize)
{
    QOpenGLContext *context = QOpenGLContext::currentContext();
    QOpenGLExtraFunctions *funcs = context->extraFunctions();
    while (true) {
        GLenum error = funcs->glGetError();
        if (error == GL_NO_ERROR || error == GL_CONTEXT_LOST)
            break;
    }
#if QT_CONFIG(opengles2)
    if (context->isOpenGLES() && context->format().majorVersion() < 3) {
        initializeProgramBinaryOES(context);
        programBinaryOES(programId, blobFormat, p, blobSize);
    } else
#endif
    funcs->glProgramBinary(programId, blobFormat, p, blobSize);

    GLenum err = funcs->glGetError();
    if (err != GL_NO_ERROR) {
        qCDebug(lcOpenGLProgramDiskCache, "Program binary failed to load for program %u, size %d, "
                                  "format 0x%x, err = 0x%x",
                programId, blobSize, blobFormat, err);
        return false;
    }
    GLint linkStatus = 0;
    funcs->glGetProgramiv(programId, GL_LINK_STATUS, &linkStatus);
    if (linkStatus != GL_TRUE) {
        qCDebug(lcOpenGLProgramDiskCache, "Program binary failed to load for program %u, size %d, "
                                  "format 0x%x, linkStatus = 0x%x, err = 0x%x",
                programId, blobSize, blobFormat, linkStatus, err);
        return false;
    }

    qCDebug(lcOpenGLProgramDiskCache, "Program binary set for program %u, size %d, format 0x%x, err = 0x%x",
            programId, blobSize, blobFormat, err);
    return true;
}